

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall QDockWidgetGroupWindow::event(QDockWidgetGroupWindow *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QLayout *pQVar3;
  QWidget *this_00;
  QDockWidgetPrivate *this_01;
  QDockWidget *pQVar4;
  int __fd;
  QChildEvent *in_RSI;
  QChildEvent *pQVar5;
  QDockWidgetPrivate *unaff_retaddr;
  QDockWidget *dw_2;
  QDockWidget *dw_1;
  QDockWidget *dw;
  QDockWidgetGroupLayout *lay;
  QEvent *in_stack_00000108;
  QWidget *in_stack_00000110;
  QDockWidgetGroupWindow *in_stack_ffffffffffffffc8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pQVar5 = in_RSI;
  pQVar3 = QWidget::layout((QWidget *)0x5f0521);
  __fd = (int)pQVar5;
  if (pQVar3 != (QLayout *)0x0) {
    __fd = (int)in_RSI;
    bVar1 = QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::windowEvent
                      ((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)lay,(QEvent *)dw)
    ;
    if (bVar1) {
      return true;
    }
  }
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 == Move) {
    this_01 = (QDockWidgetPrivate *)
              activeTabbedDockWidget
                        ((QDockWidgetGroupWindow *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (this_01 != (QDockWidgetPrivate *)0x0) {
      QObjectPrivate::get((QObject *)0x5f060d);
      QDockWidgetPrivate::moveEvent(this_01,(QMoveEvent *)in_stack_ffffffffffffffc8);
    }
    bVar1 = true;
  }
  else {
    if (TVar2 == Resize) {
      updateCurrentGapRect(in_stack_ffffffffffffffc8);
      resized((QDockWidgetGroupWindow *)0x5f069d);
    }
    else {
      if (TVar2 == Close) {
        this_00 = &activeTabbedDockWidget
                             ((QDockWidgetGroupWindow *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8))->
                   super_QWidget;
        if (this_00 != (QWidget *)0x0) {
          QWidget::close(this_00,__fd);
          adjustFlags((QDockWidgetGroupWindow *)unaff_retaddr);
        }
        return true;
      }
      if (TVar2 == ChildAdded) {
        QChildEvent::child(in_RSI);
        pQVar4 = qobject_cast<QDockWidget*>((QObject *)0x5f066b);
        if (pQVar4 != (QDockWidget *)0x0) {
          adjustFlags((QDockWidgetGroupWindow *)unaff_retaddr);
        }
      }
      else if (TVar2 == LayoutRequest) {
        destroyOrHideIfEmpty((QDockWidgetGroupWindow *)dw_1);
      }
      else if (TVar2 - NonClientAreaMouseMove < 4) {
        pQVar4 = activeTabbedDockWidget
                           ((QDockWidgetGroupWindow *)
                            CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        if (pQVar4 != (QDockWidget *)0x0) {
          QObjectPrivate::get((QObject *)0x5f0645);
          QDockWidgetPrivate::nonClientAreaMouseEvent
                    (unaff_retaddr,
                     (QMouseEvent *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        }
        return true;
      }
    }
    bVar1 = QWidget::event(in_stack_00000110,in_stack_00000108);
  }
  return bVar1;
}

Assistant:

bool QDockWidgetGroupWindow::event(QEvent *e)
{
    auto lay = static_cast<QDockWidgetGroupLayout *>(layout());
    if (lay && lay->windowEvent(e))
        return true;

    switch (e->type()) {
    case QEvent::Close:
#if QT_CONFIG(tabbar)
        // Forward the close to the QDockWidget just as if its close button was pressed
        if (QDockWidget *dw = activeTabbedDockWidget()) {
            dw->close();
            adjustFlags();
        }
#endif
        return true;
    case QEvent::Move:
#if QT_CONFIG(tabbar)
        // Let QDockWidgetPrivate::moseEvent handle the dragging
        if (QDockWidget *dw = activeTabbedDockWidget())
            static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(dw))->moveEvent(static_cast<QMoveEvent*>(e));
#endif
        return true;
    case QEvent::NonClientAreaMouseMove:
    case QEvent::NonClientAreaMouseButtonPress:
    case QEvent::NonClientAreaMouseButtonRelease:
    case QEvent::NonClientAreaMouseButtonDblClick:
#if QT_CONFIG(tabbar)
        // Let the QDockWidgetPrivate of the currently visible dock widget handle the drag and drop
        if (QDockWidget *dw = activeTabbedDockWidget())
            static_cast<QDockWidgetPrivate *>(QObjectPrivate::get(dw))->nonClientAreaMouseEvent(static_cast<QMouseEvent*>(e));
#endif
        return true;
    case QEvent::ChildAdded:
        if (qobject_cast<QDockWidget *>(static_cast<QChildEvent*>(e)->child()))
            adjustFlags();
        break;
    case QEvent::LayoutRequest:
        // We might need to show the widget again
        destroyOrHideIfEmpty();
        break;
    case QEvent::Resize:
        updateCurrentGapRect();
        emit resized();
        break;
    default:
        break;
    }
    return QWidget::event(e);
}